

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicBinding::Check(BasicBinding *this,GLenum e,GLuint expected)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  GLboolean b;
  GLint i;
  GLfloat f;
  GLdouble d;
  GLint64 i64;
  GLboolean local_49;
  uint local_48;
  float local_44;
  double local_40;
  GLenum local_38 [2];
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d3,(GLint *)&local_48);
  glu::CallLogWrapper::glGetInteger64v(this_00,0x90d3,(GLint64 *)local_38);
  glu::CallLogWrapper::glGetFloatv(this_00,0x90d3,&local_44);
  glu::CallLogWrapper::glGetDoublev(this_00,0x90d3,&local_40);
  glu::CallLogWrapper::glGetBooleanv(this_00,0x90d3,&local_49);
  bVar1 = (GLenum)(long)local_44 == e;
  bVar2 = (GLenum)(long)local_40 == e;
  bVar3 = (bool)local_49 == (e != 0);
  if (((!bVar1 || local_38[0] != e) || (!bVar3 || !bVar2)) || local_48 != e) {
    anon_unknown_0::Output
              ("%s is %d should be %d.\n","GL_SHADER_STORAGE_BUFFER_BINDING",(ulong)local_48,e);
  }
  return ((bVar1 && local_38[0] == e) && (bVar3 && bVar2)) && local_48 == e;
}

Assistant:

bool Check(GLenum e, GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegerv(e, &i);
		glGetInteger64v(e, &i64);
		glGetFloatv(e, &f);
		glGetDoublev(e, &d);
		glGetBooleanv(e, &b);

		bool status = true;
		if (static_cast<GLuint>(i) != expected)
			status = false;
		if (static_cast<GLuint>(i64) != expected)
			status = false;
		if (static_cast<GLuint>(f) != expected)
			status = false;
		if (static_cast<GLuint>(d) != expected)
			status = false;
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
			status = false;

		if (!status)
		{
			Output("%s is %d should be %d.\n", GLenumToString(e), i, expected);
		}
		return status;
	}